

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_wd_add_leaf(lyd_node **tree,lyd_node *last_parent,lys_node_leaf *leaf,unres_data *unres,
                   int check_when_must)

{
  int iVar1;
  uint uVar2;
  lys_tpdf *node;
  char *pcStack_58;
  int ret;
  char *dflt;
  lys_tpdf *tpdf;
  lyd_node *current;
  lyd_node *dummy;
  int check_when_must_local;
  unres_data *unres_local;
  lys_node_leaf *leaf_local;
  lyd_node *last_parent_local;
  lyd_node **tree_local;
  
  pcStack_58 = (char *)0x0;
  if (leaf->dflt == (char *)0x0) {
    if ((leaf->flags & 0x40) == 0) {
      for (dflt = (char *)(leaf->type).der; dflt != (char *)0x0 && pcStack_58 == (char *)0x0;
          dflt = *(char **)(dflt + 0x50)) {
        pcStack_58 = *(char **)(dflt + 0x78);
      }
    }
  }
  else {
    pcStack_58 = leaf->dflt;
  }
  if (pcStack_58 == (char *)0x0) {
    return 0;
  }
  node = (lys_tpdf *)lyd_new_dummy(*tree,last_parent,(lys_node *)leaf,pcStack_58,1);
  if ((node == (lys_tpdf *)0x0) ||
     (((tpdf = node, (lyd_node *)node->units == (lyd_node *)0x0 && (*tree != (lyd_node *)0x0)) &&
      (iVar1 = lyd_insert_sibling(tree,(lyd_node *)node), iVar1 != 0)))) {
LAB_001935c4:
    lyd_free((lyd_node *)node);
    tree_local._4_4_ = 1;
  }
  else {
    while( true ) {
      if ((check_when_must != 0) &&
         (((((*(byte *)((long)&tpdf->dsc + 1) >> 1 & 4) != 0 &&
            (iVar1 = unres_data_add(unres,(lyd_node *)tpdf,UNRES_WHEN), iVar1 == -1)) ||
           ((uVar2 = resolve_applies_must((lyd_node *)tpdf), (uVar2 & 1) != 0 &&
            (iVar1 = unres_data_add(unres,(lyd_node *)tpdf,UNRES_MUST), iVar1 == -1)))) ||
          (((uVar2 & 2) != 0 &&
           (iVar1 = unres_data_add(unres,(lyd_node *)tpdf,UNRES_MUST_INOUT), iVar1 == -1))))))
      goto LAB_001935c4;
      *(byte *)&tpdf->dsc = *(byte *)&tpdf->dsc & 0x7f;
      if ((lys_node_leaf *)tpdf->name == leaf) break;
      tpdf = (lys_tpdf *)tpdf->module;
    }
    lyd_wd_update_parents((lyd_node *)node);
    if ((short)(tpdf->type).base == LY_TYPE_LEAFREF) {
      iVar1 = unres_data_add(unres,(lyd_node *)tpdf,UNRES_LEAFREF);
joined_r0x0019359e:
      if (iVar1 != 0) goto LAB_001935c4;
    }
    else if ((short)(tpdf->type).base == LY_TYPE_INST) {
      iVar1 = unres_data_add(unres,(lyd_node *)tpdf,UNRES_INSTID);
      goto joined_r0x0019359e;
    }
    if (*tree == (lyd_node *)0x0) {
      *tree = (lyd_node *)node;
    }
    tree_local._4_4_ = 0;
  }
  return tree_local._4_4_;
}

Assistant:

static int
lyd_wd_add_leaf(struct lyd_node **tree, struct lyd_node *last_parent, struct lys_node_leaf *leaf, struct unres_data *unres,
                int check_when_must)
{
    struct lyd_node *dummy = NULL, *current;
    struct lys_tpdf *tpdf;
    const char *dflt = NULL;
    int ret;

    /* get know if there is a default value */
    if (leaf->dflt) {
        /* leaf has a default value */
        dflt = leaf->dflt;
    } else if (!(leaf->flags & LYS_MAND_TRUE)) {
        /* get the default value from the type */
        for (tpdf = leaf->type.der; tpdf && !dflt; tpdf = tpdf->type.der) {
            dflt = tpdf->dflt;
        }
    }
    if (!dflt) {
        /* no default value */
        return EXIT_SUCCESS;
    }

    /* create the node */
    if (!(dummy = lyd_new_dummy(*tree, last_parent, (struct lys_node*)leaf, dflt, 1))) {
        goto error;
    }
    if (!dummy->parent && (*tree)) {
        /* connect dummy nodes into the data tree (at the end of top level nodes) */
        if (lyd_insert_sibling(tree, dummy)) {
            goto error;
        }
    }
    for (current = dummy; ; current = current->child) {
        /* remember the created data in unres */
        if (check_when_must) {
            if ((current->when_status & LYD_WHEN) && unres_data_add(unres, current, UNRES_WHEN) == -1) {
                goto error;
            }
            ret = resolve_applies_must(current);
            if ((ret & 0x1) && (unres_data_add(unres, current, UNRES_MUST) == -1)) {
                goto error;
            }
            if ((ret & 0x2) && (unres_data_add(unres, current, UNRES_MUST_INOUT) == -1)) {
                goto error;
            }
        }

        /* clear dummy-node flag */
        current->validity &= ~LYD_VAL_INUSE;

        if (current->schema == (struct lys_node *)leaf) {
            break;
        }
    }
    /* update parent's default flag if needed */
    lyd_wd_update_parents(dummy);

    /* if necessary, remember the created data value in unres */
    if (((struct lyd_node_leaf_list *)current)->value_type == LY_TYPE_LEAFREF) {
        if (unres_data_add(unres, current, UNRES_LEAFREF)) {
            goto error;
        }
    } else if (((struct lyd_node_leaf_list *)current)->value_type == LY_TYPE_INST) {
        if (unres_data_add(unres, current, UNRES_INSTID)) {
            goto error;
        }
    }

    if (!(*tree)) {
        *tree = dummy;
    }
    return EXIT_SUCCESS;

error:
    lyd_free(dummy);
    return EXIT_FAILURE;
}